

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O2

void discordpp::to_json(json *j,field<bool> *f)

{
  logic_error *this;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *this_00;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_30;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_20;
  
  switch(f->s_) {
  case uninitialized_e:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"You can\'t convert an uninitialized field to JSON");
    goto LAB_0016b3ab;
  case present_e:
    this_00 = &local_20;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json<bool_&,_bool,_0>
              (this_00,(f->t_)._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
                       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
                       super__Head_base<0UL,_bool_*,_false>._M_head_impl);
    break;
  case omitted_e:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"You can\'t convert an omitted field to JSON");
LAB_0016b3ab:
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  case nulled_e:
    this_00 = &local_30;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json(this_00,(nullptr_t)0x0);
    break;
  default:
    goto switchD_0016b337_default;
  }
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(j,this_00);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(this_00);
switchD_0016b337_default:
  return;
}

Assistant:

void to_json(nlohmann::json &j, const field<T> &f) {
        switch (f.s_) {
        case uninitialized_e:
            throw std::logic_error(
                "You can't convert an uninitialized field to JSON");
            break;
        case present_e:
            // if constexpr (std::is_enum_v<T>) {
            //     j = static_cast<typename
            //     std::underlying_type<T>::type>(*f.t_);
            // } else {
            j = *f.t_;
            //}
            break;
        case nulled_e:
            j = nullptr;
            break;
        case omitted_e:
            throw std::logic_error(
                "You can't convert an omitted field to JSON");
            break;
        }
    }